

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_rolling_inc.h
# Opt level: O0

void InitializeHROLLING(HasherCommon *common,HROLLING *self,BrotliEncoderParams *params)

{
  ulong local_28;
  size_t i;
  BrotliEncoderParams *params_local;
  HROLLING *self_local;
  HasherCommon *common_local;
  
  self->state = 0;
  self->next_ix = 0;
  self->factor = 0x10dcd;
  self->factor_remove = 1;
  for (local_28 = 0; local_28 < 0x20; local_28 = local_28 + 1) {
    self->factor_remove = self->factor * self->factor_remove;
  }
  self->table = (uint32_t *)common->extra;
  for (local_28 = 0; local_28 < 0x1000000; local_28 = local_28 + 1) {
    self->table[local_28] = 0xffffffff;
  }
  return;
}

Assistant:

static void FN(Initialize)(
    HasherCommon* common, HashRolling* BROTLI_RESTRICT self,
    const BrotliEncoderParams* params) {
  size_t i;
  self->state = 0;
  self->next_ix = 0;

  self->factor = FN(kRollingHashMul32);

  /* Compute the factor of the oldest byte to remove: factor**steps modulo
     0xffffffff (the multiplications rely on 32-bit overflow) */
  self->factor_remove = 1;
  for (i = 0; i < CHUNKLEN; i += JUMP) {
    self->factor_remove *= self->factor;
  }

  self->table = (uint32_t*)common->extra;
  for (i = 0; i < NUMBUCKETS; i++) {
    self->table[i] = FN(kInvalidPos);
  }

  BROTLI_UNUSED(params);
}